

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O2

REF_STATUS ref_recon_abs_value_hessian2(REF_GRID ref_grid,REF_DBL *hessian)

{
  REF_NODE ref_node;
  undefined1 auVar1 [16];
  uint uVar2;
  undefined8 uVar3;
  long lVar4;
  char *pcVar5;
  REF_DBL *m;
  undefined1 local_68 [3] [16];
  
  ref_node = ref_grid->node;
  lVar4 = 0;
  m = hessian;
  do {
    if (ref_node->max <= lVar4) {
      uVar2 = ref_node_ghost_dbl(ref_node,hessian,3);
      if (uVar2 == 0) {
        uVar2 = 0;
      }
      else {
        pcVar5 = "update ghosts";
        uVar3 = 0x65f;
LAB_001d358f:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               uVar3,"ref_recon_abs_value_hessian2",(ulong)uVar2,pcVar5);
      }
      return uVar2;
    }
    if ((-1 < ref_node->global[lVar4]) && (ref_node->ref_mpi->id == ref_node->part[lVar4])) {
      uVar2 = ref_matrix_diag_m2(m,(REF_DBL *)local_68);
      if (uVar2 != 0) {
        pcVar5 = "decomp";
        uVar3 = 0x658;
        goto LAB_001d358f;
      }
      auVar1._8_8_ = local_68[0]._8_8_ ^ 0x8000000000000000;
      auVar1._0_8_ = local_68[0]._0_8_ ^ 0x8000000000000000;
      local_68[0] = maxpd(local_68[0],auVar1);
      uVar2 = ref_matrix_form_m2((REF_DBL *)local_68,m);
      if (uVar2 != 0) {
        pcVar5 = "re-form";
        uVar3 = 0x65b;
        goto LAB_001d358f;
      }
    }
    lVar4 = lVar4 + 1;
    m = m + 3;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_recon_abs_value_hessian2(REF_GRID ref_grid,
                                                       REF_DBL *hessian) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL diag_system[6];
  REF_INT node;

  /* positive eigenvalues to make positive definite */
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      RSS(ref_matrix_diag_m2(&(hessian[3 * node]), diag_system), "decomp");
      ref_matrix_eig2(diag_system, 0) = ABS(ref_matrix_eig2(diag_system, 0));
      ref_matrix_eig2(diag_system, 1) = ABS(ref_matrix_eig2(diag_system, 1));
      RSS(ref_matrix_form_m2(diag_system, &(hessian[3 * node])), "re-form");
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, hessian, 3), "update ghosts");

  return REF_SUCCESS;
}